

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

_Bool container_iterator_next
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  int iVar1;
  ushort *in_RCX;
  int *in_RDX;
  char in_SIL;
  int *in_RDI;
  uint32_t limit;
  run_container_t *rc;
  array_container_t *ac;
  uint64_t word;
  uint32_t wordindex;
  bitset_container_t *bc;
  unsigned_long_long local_40;
  uint local_34;
  _Bool local_1;
  
  if (in_SIL == '\x01') {
    *in_RDX = *in_RDX + 1;
    local_34 = *in_RDX / 0x40;
    if (local_34 < 0x400) {
      local_40 = *(ulong *)(*(long *)(in_RDI + 2) + (ulong)local_34 * 8) &
                 -1L << ((byte)((long)*in_RDX % 0x40) & 0x3f);
      while (local_40 == 0 && local_34 + 1 < 0x400) {
        local_34 = local_34 + 1;
        local_40 = *(unsigned_long_long *)(*(long *)(in_RDI + 2) + (ulong)local_34 * 8);
      }
      if (local_40 == 0) {
        local_1 = false;
      }
      else {
        iVar1 = roaring_trailing_zeroes(local_40);
        *in_RDX = local_34 * 0x40 + iVar1;
        *in_RCX = (ushort)*in_RDX;
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else if (in_SIL == '\x02') {
    *in_RDX = *in_RDX + 1;
    if (*in_RDX < *in_RDI) {
      *in_RCX = *(ushort *)(*(long *)(in_RDI + 2) + (long)*in_RDX * 2);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else if (*in_RCX == 0xffff) {
    local_1 = false;
  }
  else if ((uint)*in_RCX <
           (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)*in_RDX * 4) +
           (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)*in_RDX * 4)) {
    *in_RCX = *in_RCX + 1;
    local_1 = true;
  }
  else {
    *in_RDX = *in_RDX + 1;
    if (*in_RDX < *in_RDI) {
      *in_RCX = *(ushort *)(*(long *)(in_RDI + 2) + (long)*in_RDX * 4);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool container_iterator_next(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index++;

            uint32_t wordindex = it->index / 64;
            if (wordindex >= BITSET_CONTAINER_SIZE_IN_WORDS) {
                return false;
            }

            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            // next part could be optimized/simplified
            while (word == 0 &&
                   (wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS)) {
                wordindex++;
                word = bc->words[wordindex];
            }
            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index++;
            if (it->index < ac->cardinality) {
                *value = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == UINT16_MAX) {  // Avoid overflow to zero
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            uint32_t limit =
                rc->runs[it->index].value + rc->runs[it->index].length;
            if (*value < limit) {
                (*value)++;
                return true;
            }

            it->index++;
            if (it->index < rc->n_runs) {
                *value = rc->runs[it->index].value;
                return true;
            }
            return false;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}